

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O2

void __thiscall
slang::ast::ConstraintList::serializeTo(ConstraintList *this,ASTSerializer *serializer)

{
  pointer ppCVar1;
  size_t sVar2;
  long lVar3;
  string_view name;
  
  name._M_str = "list";
  name._M_len = 4;
  ASTSerializer::startArray(serializer,name);
  ppCVar1 = (this->list)._M_ptr;
  sVar2 = (this->list)._M_extent._M_extent_value;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    ASTSerializer::serialize(serializer,*(Constraint **)((long)ppCVar1 + lVar3));
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void ConstraintList::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("list");
    for (auto constraint : list) {
        serializer.serialize(*constraint);
    }
    serializer.endArray();
}